

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O0

Entry * __thiscall de::cmdline::detail::TypedFieldMap::get(TypedFieldMap *this,type_info *key)

{
  bool bVar1;
  pointer ppVar2;
  out_of_range *this_00;
  _Self local_28;
  _Self local_20;
  const_iterator pos;
  type_info *key_local;
  TypedFieldMap *this_local;
  
  pos._M_node = (_Base_ptr)key;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<const_std::type_info_*,_de::cmdline::detail::TypedFieldMap::Entry,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
       ::find(&this->m_fields,(key_type *)&pos);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_std::type_info_*,_de::cmdline::detail::TypedFieldMap::Entry,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
       ::end(&this->m_fields);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (!bVar1) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Value not set");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
           ::operator->(&local_20);
  return &ppVar2->second;
}

Assistant:

const TypedFieldMap::Entry& TypedFieldMap::get (const std::type_info* key) const
{
	Map::const_iterator pos = m_fields.find(key);
	if (pos != m_fields.end())
		return pos->second;
	else
		throw std::out_of_range("Value not set");
}